

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

int __thiscall
QAccessibleTabBar::select
          (QAccessibleTabBar *this,int __nfds,fd_set *__readfds,fd_set *__writefds,
          fd_set *__exceptfds,timeval *__timeout)

{
  undefined8 uVar1;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  bool bVar2;
  int childIndex;
  int index;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  uVar1 = (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x58))
                    (this,CONCAT44(in_register_00000034,__nfds));
  index = (int)((ulong)this >> 0x20);
  bVar2 = -1 < (int)uVar1;
  if (bVar2) {
    tabBar((QAccessibleTabBar *)0x7d4c5a);
    QTabBar::setCurrentIndex
              ((QTabBar *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),index);
    uVar1 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)uVar1 >> 8),bVar2);
}

Assistant:

bool QAccessibleTabBar::select(QAccessibleInterface *childItem)
{
    const int childIndex = indexOfChild(childItem);
    if (childIndex >= 0) {
        tabBar()->setCurrentIndex(childIndex);
        return true;
    }
    return false;
}